

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream-c.cpp
# Opt level: O2

duckdb_data_chunk duckdb_stream_fetch_chunk(duckdb_result result)

{
  duckdb_result result_00;
  undefined1 auVar1 [32];
  pointer pQVar2;
  duckdb_data_chunk p_Var3;
  undefined1 in_stack_00000040 [16];
  
  if (result.deprecated_error_message != (char *)0x0) {
    pQVar2 = duckdb::unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>
             ::operator->((unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true>
                           *)result.deprecated_error_message);
    if ((pQVar2->super_BaseQueryResult).type == STREAM_RESULT) {
      auVar1 = result._16_32_;
      result_00._32_16_ = in_stack_00000040;
      result_00.deprecated_column_count = auVar1._0_8_;
      result_00.deprecated_row_count = auVar1._8_8_;
      result_00.deprecated_rows_changed = auVar1._16_8_;
      result_00.deprecated_columns = (duckdb_column *)auVar1._24_8_;
      p_Var3 = duckdb_fetch_chunk(result_00);
      return p_Var3;
    }
  }
  return (duckdb_data_chunk)0x0;
}

Assistant:

duckdb_data_chunk duckdb_stream_fetch_chunk(duckdb_result result) {
	if (!result.internal_data) {
		return nullptr;
	}
	auto &result_data = *((duckdb::DuckDBResultData *)result.internal_data);
	if (result_data.result->type != duckdb::QueryResultType::STREAM_RESULT) {
		// We can only fetch from a StreamQueryResult
		return nullptr;
	}
	return duckdb_fetch_chunk(result);
}